

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O1

V3f __thiscall Imf_2_5::anon_unknown_22::ywFromHeader(anon_unknown_22 *this,Header *header)

{
  bool bVar1;
  Chromaticities *pCVar2;
  V3f VVar3;
  Chromaticities local_58;
  V2f local_30;
  V2f local_28;
  V2f local_20;
  V2f local_18;
  
  local_18.x = 0.64;
  local_18.y = 0.33;
  local_20.x = 0.3;
  local_20.y = 0.6;
  local_28.x = 0.15;
  local_28.y = 0.06;
  local_30.x = 0.3127;
  local_30.y = 0.329;
  Chromaticities::Chromaticities(&local_58,&local_18,&local_20,&local_28,&local_30);
  bVar1 = hasChromaticities(header);
  if (bVar1) {
    pCVar2 = chromaticities(header);
    local_58.red = pCVar2->red;
    local_58.green = pCVar2->green;
    local_58.blue = pCVar2->blue;
    local_58.white = pCVar2->white;
  }
  VVar3 = RgbaYca::computeYw((RgbaYca *)this,&local_58);
  return VVar3;
}

Assistant:

V3f
ywFromHeader (const Header &header)
{
    Chromaticities cr;

    if (hasChromaticities (header))
	cr = chromaticities (header);

    return computeYw (cr);
}